

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall Js::FunctionBody::RedeferFunction(FunctionBody *this)

{
  undefined1 *puVar1;
  uint uVar2;
  ThreadContext *pTVar3;
  SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
  *pSVar4;
  WriteBarrierPtr<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_> *pWVar5;
  FunctionInfo *this_00;
  code *pcVar6;
  bool bVar7;
  LocalFunctionId LVar8;
  uint uVar9;
  int iVar10;
  undefined4 *puVar11;
  ByteBlock *pBVar12;
  ulong uVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ParseableFunctionInfo *ptr;
  char16_t *pcVar14;
  ulong uVar15;
  
  bVar7 = FunctionProxy::CanBeDeferred((FunctionProxy *)this);
  if (!bVar7) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar11 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x3bc,"(this->CanBeDeferred())","this->CanBeDeferred()");
    if (!bVar7) {
      pcVar6 = (code *)invalidInstructionException();
      (*pcVar6)();
    }
    *puVar11 = 0;
  }
  uVar9 = ((((((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->
             m_srcInfo).ptr)->sourceContextInfo).ptr)->sourceContextId;
  LVar8 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this);
  bVar7 = Phases::IsEnabled((Phases *)&DAT_01450888,RedeferralPhase,uVar9,LVar8);
  if (bVar7) {
    pTVar3 = ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
             threadContext;
    pTVar3->redeferredFunctions = pTVar3->redeferredFunctions + 1;
    uVar9 = GetInlineCacheCount(this);
    pTVar3->recoveredBytes = uVar9 * 0x20 + pTVar3->recoveredBytes + 0x1e8;
    pBVar12 = (this->byteCodeBlock).ptr;
    if (pBVar12 != (ByteBlock *)0x0) {
      uVar9 = ByteBlock::GetLength(pBVar12);
      pTVar3->recoveredBytes = pTVar3->recoveredBytes + uVar9;
      pBVar12 = FunctionProxy::GetAuxPtr<(Js::FunctionProxy::AuxPointerType)15,Js::ByteBlock*>
                          ((FunctionProxy *)this);
      if (pBVar12 != (ByteBlock *)0x0) {
        pBVar12 = FunctionProxy::GetAuxPtr<(Js::FunctionProxy::AuxPointerType)15,Js::ByteBlock*>
                            ((FunctionProxy *)this);
        uVar9 = ByteBlock::GetLength(pBVar12);
        pTVar3->recoveredBytes = pTVar3->recoveredBytes + uVar9;
      }
    }
    pSVar4 = (this->entryPoints).ptr;
    if (pSVar4 != (SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
                   *)0x0) {
      uVar2 = (pSVar4->
              super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ).
              super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
              .count;
      pWVar5 = (pSVar4->
               super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ).
               super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
               .buffer.ptr;
      uVar15 = 0;
      uVar13 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar13 = uVar15;
      }
      for (; uVar13 != uVar15; uVar15 = uVar15 + 1) {
        if (((pWVar5[uVar15].ptr)->super_RecyclerWeakReferenceBase).strongRef != (Type)0x0) {
          pTVar3->recoveredBytes = pTVar3->recoveredBytes + 8;
        }
      }
    }
  }
  puVar1 = &(this->counters).field_0x1;
  *puVar1 = *puVar1 & 0xfe;
  uVar9 = ((((((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->
             m_srcInfo).ptr)->sourceContextInfo).ptr)->sourceContextId;
  LVar8 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this);
  bVar7 = Phases::IsEnabled((Phases *)&DAT_01453738,RedeferralPhase,uVar9,LVar8);
  if (bVar7) {
    uVar2 = ((((((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->
               m_srcInfo).ptr)->sourceContextInfo).ptr)->sourceContextId;
    LVar8 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this);
    iVar10 = (*(this->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
               super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(this);
    if (CONCAT44(extraout_var,iVar10) == 0) {
      pcVar14 = L"Anonymous function)";
    }
    else {
      iVar10 = (*(this->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
                 super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(this);
      pcVar14 = (char16_t *)CONCAT44(extraout_var_00,iVar10);
    }
    Output::Print(L"Redeferring function %d.%d: %s\n",(ulong)uVar2,(ulong)LVar8,pcVar14);
    Output::Flush();
  }
  ptr = ParseableFunctionInfo::NewDeferredFunctionFromFunctionBody(this);
  this_00 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  RedeferFunctionObjectTypes(this);
  Cleanup(this,false);
  if ((this->field_0x178 & 8) != 0) {
    Utf8SourceInfo::RemoveFunctionBody
              ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr,this);
  }
  *(undefined1 *)&this_00->attributes = (char)this_00->attributes | DeferredParse;
  Memory::WriteBarrierPtr<Js::FunctionProxy>::WriteBarrierSet
            (&this_00->functionBodyImpl,&ptr->super_FunctionProxy);
  FunctionInfo::SetOriginalEntryPoint(this_00,InterpreterStackFrame::DelayDynamicInterpreterThunk);
  return;
}

Assistant:

void FunctionBody::RedeferFunction()
    {
        Assert(this->CanBeDeferred());

#if DBG
        if (PHASE_STATS(RedeferralPhase, this))
        {
            ThreadContext * threadContext = this->GetScriptContext()->GetThreadContext();
            threadContext->redeferredFunctions++;
            threadContext->recoveredBytes += sizeof(*this) + this->GetInlineCacheCount() * sizeof(InlineCache);
            if (this->byteCodeBlock)
            {
                threadContext->recoveredBytes += this->byteCodeBlock->GetLength();
                if (this->GetAuxiliaryData())
                {
                    threadContext->recoveredBytes += this->GetAuxiliaryData()->GetLength();
                }
            }
            this->MapEntryPoints([&](int index, FunctionEntryPointInfo * info) {
                threadContext->recoveredBytes += sizeof(info);
            });

            // TODO: Get size of polymorphic caches, jitted code, etc.
        }

        // We can't get here if the function is being jitted. Jitting was either completed or not begun.
        this->UnlockCounters();
#endif

        PHASE_PRINT_TRACE(Js::RedeferralPhase, this, _u("Redeferring function %d.%d: %s\n"),
                          GetSourceContextId(), GetLocalFunctionId(),
                          GetDisplayName() ? GetDisplayName() : _u("Anonymous function)"));

        ParseableFunctionInfo * parseableFunctionInfo =
            Js::ParseableFunctionInfo::NewDeferredFunctionFromFunctionBody(this);
        FunctionInfo * functionInfo = this->GetFunctionInfo();

        this->RedeferFunctionObjectTypes();

        this->Cleanup(false);

        if (GetIsFuncRegistered())
        {
            this->GetUtf8SourceInfo()->RemoveFunctionBody(this);
        }

        // New allocation is done at this point, so update existing structures
        // Adjust functionInfo attributes, point to new proxy
        functionInfo->SetAttributes((FunctionInfo::Attributes)(functionInfo->GetAttributes() | FunctionInfo::Attributes::DeferredParse));
        functionInfo->SetFunctionProxy(parseableFunctionInfo);
        functionInfo->SetOriginalEntryPoint(DefaultEntryThunk);
    }